

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataDeviceHandleDataOffer(void *userData,wl_data_device *device,wl_data_offer *offer)

{
  _GLFWofferWayland *p_Var1;
  _GLFWofferWayland *p_Var2;
  wl_data_offer *in_RDX;
  _GLFWofferWayland *offers;
  wl_data_offer_listener *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  p_Var1 = (_GLFWofferWayland *)
           _glfw_realloc((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0);
  if (p_Var1 == (_GLFWofferWayland *)0x0) {
    _glfwInputError(0x10005,(char *)0x0);
  }
  else {
    p_Var2 = p_Var1 + _glfw.wl.offerCount;
    _glfw.wl.offers = p_Var1;
    _glfw.wl.offerCount = _glfw.wl.offerCount + 1;
    p_Var2->offer = in_RDX;
    p_Var2->text_plain_utf8 = 0;
    p_Var2->text_uri_list = 0;
    wl_data_offer_add_listener(in_RDX,in_stack_ffffffffffffffc8,(void *)0x9e83d7);
  }
  return;
}

Assistant:

static void dataDeviceHandleDataOffer(void* userData,
                                      struct wl_data_device* device,
                                      struct wl_data_offer* offer)
{
    _GLFWofferWayland* offers =
        _glfw_realloc(_glfw.wl.offers,
                      sizeof(_GLFWofferWayland) * (_glfw.wl.offerCount + 1));
    if (!offers)
    {
        _glfwInputError(GLFW_OUT_OF_MEMORY, NULL);
        return;
    }

    _glfw.wl.offers = offers;
    _glfw.wl.offerCount++;

    _glfw.wl.offers[_glfw.wl.offerCount - 1] = (_GLFWofferWayland) { offer };
    wl_data_offer_add_listener(offer, &dataOfferListener, NULL);
}